

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int gen_publickey_from_ed_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,EVP_PKEY *pk)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  char *errmsg;
  size_t sVar4;
  uchar *bufPos;
  size_t rawKeyLen;
  size_t *local_58;
  size_t *local_50;
  uchar **local_48;
  char methodName [12];
  
  builtin_strncpy(methodName,"ssh-ed25519",0xc);
  rawKeyLen = 0;
  bufPos = (uchar *)0x0;
  local_50 = method_len;
  local_48 = pubkeydata;
  puVar2 = (uchar *)(*session->alloc)(0xb,&session->abstract);
  if (puVar2 == (uchar *)0x0) {
    _libssh2_error(session,-6,"Unable to allocate memory for private key data");
    return -1;
  }
  builtin_memcpy(puVar2,"ssh-ed25519",0xb);
  iVar1 = EVP_PKEY_get_raw_public_key(pk,0,&rawKeyLen);
  if (iVar1 == 1) {
    sVar4 = rawKeyLen + 0x13;
    local_58 = pubkeydata_len;
    puVar3 = (uchar *)(*session->alloc)(sVar4,&session->abstract);
    bufPos = puVar3;
    if (puVar3 != (uchar *)0x0) {
      _libssh2_store_str(&bufPos,methodName,0xb);
      _libssh2_store_u32(&bufPos,(uint32_t)rawKeyLen);
      iVar1 = EVP_PKEY_get_raw_public_key(pk,bufPos,&rawKeyLen);
      if (iVar1 == 1) {
        *method = puVar2;
        if (local_50 != (size_t *)0x0) {
          *local_50 = 0xb;
        }
        *local_48 = puVar3;
        if (local_58 == (size_t *)0x0) {
          return 0;
        }
        *local_58 = sVar4;
        return 0;
      }
      _libssh2_error(session,-0xe,"EVP_PKEY_get_raw_public_key failed");
      goto LAB_0010ff22;
    }
    errmsg = "Unable to allocate memory for private key data";
    iVar1 = -6;
  }
  else {
    errmsg = "EVP_PKEY_get_raw_public_key failed";
    iVar1 = -0xe;
  }
  _libssh2_error(session,iVar1,errmsg);
  puVar3 = (uchar *)0x0;
LAB_0010ff22:
  (*session->free)(puVar2,&session->abstract);
  if (puVar3 != (uchar *)0x0) {
    (*session->free)(puVar3,&session->abstract);
  }
  return -1;
}

Assistant:

static int
gen_publickey_from_ed_evp(LIBSSH2_SESSION *session,
                          unsigned char **method,
                          size_t *method_len,
                          unsigned char **pubkeydata,
                          size_t *pubkeydata_len,
                          EVP_PKEY *pk)
{
    const char methodName[] = "ssh-ed25519";
    unsigned char *methodBuf = NULL;
    size_t rawKeyLen = 0;
    unsigned char *keyBuf = NULL;
    size_t bufLen = 0;
    unsigned char *bufPos = NULL;

    _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                   "Computing public key from ED private key envelope"));

    methodBuf = LIBSSH2_ALLOC(session, sizeof(methodName) - 1);
    if(!methodBuf) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for private key data");
        goto fail;
    }
    memcpy(methodBuf, methodName, sizeof(methodName) - 1);

    if(EVP_PKEY_get_raw_public_key(pk, NULL, &rawKeyLen) != 1) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "EVP_PKEY_get_raw_public_key failed");
        goto fail;
    }

    /* Key form is: type_len(4) + type(11) + pub_key_len(4) + pub_key(32). */
    bufLen = 4 + sizeof(methodName) - 1  + 4 + rawKeyLen;
    bufPos = keyBuf = LIBSSH2_ALLOC(session, bufLen);
    if(!keyBuf) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for private key data");
        goto fail;
    }

    _libssh2_store_str(&bufPos, methodName, sizeof(methodName) - 1);
    _libssh2_store_u32(&bufPos, (uint32_t) rawKeyLen);

    if(EVP_PKEY_get_raw_public_key(pk, bufPos, &rawKeyLen) != 1) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "EVP_PKEY_get_raw_public_key failed");
        goto fail;
    }

    *method = methodBuf;
    if(method_len) {
        *method_len = sizeof(methodName) - 1;
    }
    *pubkeydata = keyBuf;
    if(pubkeydata_len) {
        *pubkeydata_len = bufLen;
    }
    return 0;

fail:
    if(methodBuf)
        LIBSSH2_FREE(session, methodBuf);
    if(keyBuf)
        LIBSSH2_FREE(session, keyBuf);
    return -1;
}